

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

void uECC_compress(uint8_t *public_key,uint8_t *compressed,uECC_Curve curve)

{
  char cVar1;
  long lVar2;
  
  cVar1 = curve->num_bytes;
  if ('\0' < cVar1) {
    lVar2 = 0;
    do {
      compressed[lVar2 + 1] = public_key[lVar2];
      lVar2 = lVar2 + 1;
      cVar1 = curve->num_bytes;
    } while (lVar2 < cVar1);
  }
  *compressed = public_key[(long)cVar1 * 2 + -1] & 1 | 2;
  return;
}

Assistant:

void uECC_compress(const uint8_t *public_key, uint8_t *compressed, uECC_Curve curve) {
    wordcount_t i;
    for (i = 0; i < curve->num_bytes; ++i) {
        compressed[i+1] = public_key[i];
    }
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    compressed[0] = 2 + (public_key[curve->num_bytes] & 0x01);
#else
    compressed[0] = 2 + (public_key[curve->num_bytes * 2 - 1] & 0x01);
#endif
}